

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

void __thiscall
vkb::SwapchainBuilder::SwapchainBuilder(SwapchainBuilder *this,Device *device,VkSurfaceKHR surface)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  pointer pVVar6;
  Device temp_device;
  PhysicalDevice local_730;
  VkSurfaceKHR local_70;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> local_68;
  VkAllocationCallbacks *local_50;
  PFN_vkGetDeviceProcAddr p_Stack_48;
  undefined8 local_40;
  PFN_vkGetDeviceQueue p_Stack_38;
  PFN_vkDestroyDevice local_30;
  
  *(undefined8 *)
   ((long)&(this->info).pNext_chain.
           super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->info).pNext_chain.
           super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).physical_device = (VkPhysicalDevice)0x0;
  (this->info).device = (VkDevice)0x0;
  (this->info).surface = (VkSurfaceKHR)0x0;
  (this->info).desired_formats.
  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).desired_formats.
  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).desired_formats.
  super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info).instance_version = 0x400000;
  (this->info).desired_width = 0x100;
  (this->info).desired_height = 0x100;
  (this->info).array_layer_count = 1;
  (this->info).min_image_count = 0;
  (this->info).required_min_image_count = 0;
  (this->info).image_usage_flags = 0x10;
  (this->info).graphics_queue_index = 0;
  (this->info).present_queue_index = 0;
  (this->info).pre_transform = 0;
  (this->info).composite_alpha = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
  (this->info).desired_present_modes.
  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).desired_present_modes.
  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).desired_present_modes.
  super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info).clipped = true;
  (this->info).old_swapchain = (VkSwapchainKHR)0x0;
  (this->info).allocation_callbacks = (VkAllocationCallbacks *)0x0;
  (this->info).physical_device = (device->physical_device).physical_device;
  (this->info).device = device->device;
  (this->info).surface = surface;
  (this->info).instance_version = device->instance_version;
  PhysicalDevice::PhysicalDevice(&local_730,&device->physical_device);
  local_70 = device->surface;
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::vector
            (&local_68,&device->queue_families);
  local_30 = (device->internal_table).fp_vkDestroyDevice;
  local_50 = device->allocation_callbacks;
  p_Stack_48 = device->fp_vkGetDeviceProcAddr;
  local_40 = *(undefined8 *)&device->instance_version;
  p_Stack_38 = (device->internal_table).fp_vkGetDeviceQueue;
  local_70 = surface;
  uVar1 = detail::get_present_queue_index(local_730.physical_device,surface,&local_68);
  uVar2 = 0;
  if (uVar1 != 0xffffffff) {
    uVar2 = uVar1;
  }
  uVar4 = (int)((ulong)((long)local_68.
                              super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_68.
                             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  uVar3 = 0xffffffff;
  if (uVar4 != 0) {
    uVar5 = 0;
    pVVar6 = local_68.
             super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      if ((pVVar6->queueFlags & 1) != 0) {
        uVar3 = (uint32_t)uVar5;
        break;
      }
      uVar5 = uVar5 + 1;
      pVVar6 = pVVar6 + 1;
    } while (uVar4 != uVar5);
  }
  if ((uVar1 != 0xffffffff) && (uVar3 != 0xffffffff)) {
    (this->info).graphics_queue_index = uVar3;
    (this->info).present_queue_index = uVar2;
    if (local_68.
        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_730.extended_features_chain.nodes.
        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_730.extended_features_chain.nodes.
                      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_730.extended_features_chain.nodes.
                            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_730.extended_features_chain.nodes.
                            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_730.queue_families.
        super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_730.queue_families.
                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_730.queue_families.
                            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_730.queue_families.
                            super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_730.available_extensions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_730.extensions_to_enable);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_730.name._M_dataplus._M_p != &local_730.name.field_2) {
      operator_delete(local_730.name._M_dataplus._M_p,
                      local_730.name.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  __assert_fail("graphics.has_value() && present.has_value() && \"Graphics and Present queue indexes must be valid\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                ,0x757,"vkb::SwapchainBuilder::SwapchainBuilder(const Device &, const VkSurfaceKHR)"
               );
}

Assistant:

SwapchainBuilder::SwapchainBuilder(Device const& device, VkSurfaceKHR const surface) {
    info.physical_device = device.physical_device.physical_device;
    info.device = device.device;
    info.surface = surface;
    info.instance_version = device.instance_version;
    Device temp_device = device;
    temp_device.surface = surface;
    auto present = temp_device.get_queue_index(QueueType::present);
    auto graphics = temp_device.get_queue_index(QueueType::graphics);
    assert(graphics.has_value() && present.has_value() && "Graphics and Present queue indexes must be valid");
    info.graphics_queue_index = graphics.value();
    info.present_queue_index = present.value();
}